

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log_<double>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,double *args)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  log_msg log_msg;
  memory_buf_t buf;
  log_msg local_1b8;
  buffer<char> local_158;
  char local_138 [264];
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if (iVar1 <= (int)lvl || traceback_enabled) {
    local_158.ptr_ = local_138;
    local_158.size_ = 0;
    local_158._vptr_buffer = (_func_int **)&PTR_grow_001db070;
    local_158.capacity_ = 0xfa;
    local_1b8.logger_name.data_ = (char *)*args;
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_1b8;
    args_00.desc_ = 10;
    ::fmt::v9::detail::vformat_to<char>(&local_158,fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_158.size_;
    msg.data_ = local_158.ptr_;
    details::log_msg::log_msg(&local_1b8,loc,a_logger_name,lvl,msg);
    log_it_(this,&local_1b8,iVar1 <= (int)lvl,traceback_enabled);
    if (local_158.ptr_ != local_138) {
      operator_delete(local_158.ptr_,local_158.capacity_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(std::forward<Args>(args)...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(std::forward<Args>(args)...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }